

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void test_readers_writers_with_handle_pool
               (int nhandles,int nfiles,int writers,int readers,bool useSnapHandlePool,int time)

{
  undefined8 *puVar1;
  char *pcVar2;
  StatAggregator *this;
  uint uVar3;
  int iVar4;
  long *plVar5;
  SnapHandlePool *pSVar6;
  pthread_t *ppVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  size_type *psVar11;
  ulong *puVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint __uval;
  int iVar13;
  ulong uVar14;
  pthread_t *ppVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  string __str;
  string test_title;
  string __str_3;
  ops_args oa;
  string __str_2;
  string __str_4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string __str_1;
  timeval __test_begin;
  char *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  value_type local_1f0;
  SnapHandlePool *local_1d0;
  ulong local_1c8;
  uint local_1c0;
  uint local_1bc;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  SnapHandlePool *local_158;
  float local_150;
  undefined1 local_14c;
  ulong *local_148;
  long local_140;
  ulong local_138 [2];
  undefined8 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  timeval local_40;
  
  uVar19 = (ulong)(uint)writers;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  usecase_test* > errorlog.txt");
  if (nfiles < 1) {
    fprintf(_stderr,"[ERROR] Invalid number of files: %d!",nfiles);
    return;
  }
  local_1d0 = (SnapHandlePool *)CONCAT44(local_1d0._4_4_,time);
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar17 = 1;
  local_1c8 = (ulong)(uint)readers;
  do {
    uVar16 = 1;
    if (9 < uVar17) {
      uVar10 = (ulong)uVar17;
      uVar18 = 4;
      do {
        uVar16 = uVar18;
        uVar3 = (uint)uVar10;
        if (uVar3 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_001064eb;
        }
        if (uVar3 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_001064eb;
        }
        if (uVar3 < 10000) goto LAB_001064eb;
        uVar10 = uVar10 / 10000;
        uVar18 = uVar16 + 4;
      } while (99999 < uVar3);
      uVar16 = uVar16 + 1;
    }
LAB_001064eb:
    local_210 = (char *)&local_200;
    std::__cxx11::string::_M_construct((ulong)&local_210,(char)uVar16);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_210,uVar16,uVar17);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x1421af);
    psVar11 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1f0.field_2._M_allocated_capacity = *psVar11;
      local_1f0.field_2._8_8_ = plVar5[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar11;
      local_1f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_210 != (char *)&local_200) {
      operator_delete(local_210);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_a8,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    bVar20 = uVar17 != nfiles;
    uVar17 = uVar17 + 1;
  } while (bVar20);
  uVar17 = (int)local_1c8 + writers;
  if (uVar17 == 0 || SCARRY4((int)local_1c8,writers) != (int)uVar17 < 0) {
    fprintf(_stderr,"[ERROR] Invalid number of readers (%d)/writers (%d)!",local_1c8,uVar19);
    goto LAB_00106ed9;
  }
  if (useSnapHandlePool) {
    pSVar6 = (SnapHandlePool *)operator_new(0x98);
    this_00 = &local_70;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,&local_a8);
    SnapHandlePool::SnapHandlePool(pSVar6,this_00,nhandles);
  }
  else {
    pSVar6 = (SnapHandlePool *)operator_new(0x58);
    this_00 = &local_58;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,&local_a8);
    FileHandlePool::FileHandlePool((FileHandlePool *)pSVar6,this_00,nhandles);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  local_1bc = uVar17;
  ppVar7 = (pthread_t *)operator_new__((ulong)uVar17 * 8);
  local_150 = (float)(int)local_1d0;
  uVar10 = 0;
  local_1d0 = pSVar6;
  local_158 = pSVar6;
  local_14c = useSnapHandlePool;
  if (0 < writers) {
    uVar14 = uVar19;
    ppVar15 = ppVar7;
    do {
      pthread_create(ppVar15,(pthread_attr_t *)0x0,invoke_writer_ops,&local_158);
      ppVar15 = ppVar15 + 1;
      uVar14 = uVar14 - 1;
      uVar10 = uVar19;
    } while (uVar14 != 0);
  }
  uVar16 = (uint)uVar10;
  iVar4 = (int)local_1c8;
  if (0 < iVar4) {
    ppVar15 = ppVar7 + uVar10;
    iVar13 = 0;
    local_1c0 = uVar16;
    do {
      pthread_create(ppVar15,(pthread_attr_t *)0x0,invoke_reader_ops,&local_158);
      ppVar15 = ppVar15 + 1;
      iVar13 = iVar13 + -1;
    } while (-iVar4 != iVar13);
    uVar16 = local_1c0 - iVar13;
  }
  if (uVar16 != local_1bc) {
    __assert_fail("threadid == readers + writers",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                  ,0x288,"void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)"
                 );
  }
  uVar19 = 0;
  do {
    iVar4 = pthread_join(ppVar7[uVar19],(void **)0x0);
    if (iVar4 != 0) {
      __assert_fail("r == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/usecase/usecase_test.cc"
                    ,0x28d,
                    "void test_readers_writers_with_handle_pool(int, int, int, int, bool, int)");
    }
    uVar19 = uVar19 + 1;
  } while (uVar17 != uVar19);
  operator_delete__(ppVar7);
  uVar19 = local_1c8;
  uVar17 = -nhandles;
  if (0 < nhandles) {
    uVar17 = nhandles;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar10 = (ulong)uVar17;
    uVar18 = 4;
    do {
      uVar16 = uVar18;
      uVar3 = (uint)uVar10;
      if (uVar3 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_001067cc;
      }
      if (uVar3 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_001067cc;
      }
      if (uVar3 < 10000) goto LAB_001067cc;
      uVar10 = uVar10 / 10000;
      uVar18 = uVar16 + 4;
    } while (99999 < uVar3);
    uVar16 = uVar16 + 1;
  }
LAB_001067cc:
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct((ulong)local_90,(char)uVar16 - (char)(nhandles >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90[0] + ((uint)nhandles >> 0x1f),uVar16,uVar17);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
  local_198 = (ulong *)*plVar5;
  puVar12 = (ulong *)(plVar5 + 2);
  if (local_198 == puVar12) {
    local_188 = *puVar12;
    lStack_180 = plVar5[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar12;
  }
  local_190 = plVar5[1];
  *plVar5 = (long)puVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar17 = 1;
  if (9 < (uint)nfiles) {
    uVar16 = nfiles;
    uVar18 = 4;
    do {
      uVar17 = uVar18;
      if (uVar16 < 100) {
        uVar17 = uVar17 - 2;
        goto LAB_001068bd;
      }
      if (uVar16 < 1000) {
        uVar17 = uVar17 - 1;
        goto LAB_001068bd;
      }
      if (uVar16 < 10000) goto LAB_001068bd;
      bVar20 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      uVar18 = uVar17 + 4;
    } while (bVar20);
    uVar17 = uVar17 + 1;
  }
LAB_001068bd:
  local_148 = local_138;
  std::__cxx11::string::_M_construct((ulong)&local_148,(char)uVar17);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_148,uVar17,nfiles);
  uVar10 = 0xf;
  if (local_198 != &local_188) {
    uVar10 = local_188;
  }
  if (uVar10 < (ulong)(local_140 + local_190)) {
    uVar10 = 0xf;
    if (local_148 != local_138) {
      uVar10 = local_138[0];
    }
    if (uVar10 < (ulong)(local_140 + local_190)) goto LAB_00106940;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_00106940:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_148);
  }
  local_128 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_128 == puVar1) {
    local_118 = *puVar1;
    uStack_110 = puVar8[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *puVar1;
  }
  local_120 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_178 = (ulong *)*plVar5;
  puVar12 = (ulong *)(plVar5 + 2);
  if (local_178 == puVar12) {
    local_168 = *puVar12;
    lStack_160 = plVar5[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar12;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)puVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar17 = -writers;
  if (0 < writers) {
    uVar17 = writers;
  }
  uVar16 = 1;
  if (9 < uVar17) {
    uVar10 = (ulong)uVar17;
    uVar18 = 4;
    do {
      uVar16 = uVar18;
      uVar3 = (uint)uVar10;
      if (uVar3 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_00106a7b;
      }
      if (uVar3 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_00106a7b;
      }
      if (uVar3 < 10000) goto LAB_00106a7b;
      uVar10 = uVar10 / 10000;
      uVar18 = uVar16 + 4;
    } while (99999 < uVar3);
    uVar16 = uVar16 + 1;
  }
LAB_00106a7b:
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar16 - (char)(writers >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)writers >> 0x1f) + (long)local_1b8),uVar16,uVar17);
  uVar10 = 0xf;
  if (local_178 != &local_168) {
    uVar10 = local_168;
  }
  if (uVar10 < (ulong)(local_1b0 + local_170)) {
    uVar10 = 0xf;
    if (local_1b8 != local_1a8) {
      uVar10 = local_1a8[0];
    }
    if (uVar10 < (ulong)(local_1b0 + local_170)) goto LAB_00106b04;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_00106b04:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1b8);
  }
  local_108 = (undefined8 *)*puVar8;
  puVar1 = puVar8 + 2;
  if (local_108 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar8[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *puVar1;
  }
  local_100 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_e8 = (ulong *)*plVar5;
  puVar12 = (ulong *)(plVar5 + 2);
  if (local_e8 == puVar12) {
    local_d8 = *puVar12;
    lStack_d0 = plVar5[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar12;
  }
  local_e0 = plVar5[1];
  *plVar5 = (long)puVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar16 = (uint)uVar19;
  uVar17 = -uVar16;
  if (0 < (int)uVar16) {
    uVar17 = uVar16;
  }
  uVar18 = 1;
  if (9 < uVar17) {
    uVar10 = (ulong)uVar17;
    uVar3 = 4;
    do {
      uVar18 = uVar3;
      uVar9 = (uint)uVar10;
      if (uVar9 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_00106c37;
      }
      if (uVar9 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_00106c37;
      }
      if (uVar9 < 10000) goto LAB_00106c37;
      uVar10 = uVar10 / 10000;
      uVar3 = uVar18 + 4;
    } while (99999 < uVar9);
    uVar18 = uVar18 + 1;
  }
LAB_00106c37:
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar18 - ((char)(uVar19 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar16 >> 0x1f) + (long)local_c8),uVar18,uVar17);
  uVar19 = 0xf;
  if (local_e8 != &local_d8) {
    uVar19 = local_d8;
  }
  if (uVar19 < (ulong)(local_c0 + local_e0)) {
    uVar19 = 0xf;
    if (local_c8 != local_b8) {
      uVar19 = local_b8[0];
    }
    if (uVar19 < (ulong)(local_c0 + local_e0)) goto LAB_00106ccd;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_00106ccd:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
  }
  local_210 = (char *)*puVar8;
  pcVar2 = (char *)(puVar8 + 2);
  if (local_210 == pcVar2) {
    local_200 = *(undefined8 *)pcVar2;
    uStack_1f8 = puVar8[3];
    local_210 = (char *)&local_200;
  }
  else {
    local_200 = *(undefined8 *)pcVar2;
  }
  local_208 = puVar8[1];
  *puVar8 = pcVar2;
  puVar8[1] = 0;
  *pcVar2 = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
  local_1f0._M_dataplus._M_p = (pointer)*puVar8;
  psVar11 = puVar8 + 2;
  if ((size_type *)local_1f0._M_dataplus._M_p == psVar11) {
    local_1f0.field_2._M_allocated_capacity = *psVar11;
    local_1f0.field_2._8_8_ = puVar8[3];
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar11;
  }
  local_1f0._M_string_length = puVar8[1];
  *puVar8 = psVar11;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  if (local_210 != (char *)&local_200) {
    operator_delete(local_210);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  pSVar6 = local_1d0;
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  std::__cxx11::string::append((char *)&local_1f0);
  this = (pSVar6->super_FileHandlePool).sa;
  if (this != (StatAggregator *)0x0) {
    StatAggregator::aggregateAndPrintStats
              (this,local_1f0._M_dataplus._M_p,(pSVar6->super_FileHandlePool).samples,"ms");
  }
  (*(pSVar6->super_FileHandlePool)._vptr_FileHandlePool[1])(pSVar6);
  fdb_shutdown();
  system("rm -rf  usecase_test* > errorlog.txt");
  memleak_end();
  test_readers_writers_with_handle_pool();
LAB_00106ed9:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void test_readers_writers_with_handle_pool(int nhandles,
                                           int nfiles,
                                           int writers,
                                           int readers,
                                           bool useSnapHandlePool,
                                           int time) {
    TEST_INIT();
    memleak_start();

    int r;

    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;

    if (nfiles < 1) {
        fprintf(stderr, "[ERROR] Invalid number of files: %d!", nfiles);
        return;
    }

    // Set filename(s)
    std::vector<std::string> files;
    for (int i = 1; i <= nfiles; ++i) {
        std::string filename("./usecase_test" + std::to_string(i));
        files.push_back(filename);
    }

    if (writers + readers < 1) {
        fprintf(stderr, "[ERROR] Invalid number of readers (%d)/writers (%d)!",
                readers, writers);
        return;
    }

    // Prepare handle pool
    FileHandlePool *hp;
    if (!useSnapHandlePool) {
        hp = new FileHandlePool(files, nhandles);
    } else {
        hp = new SnapHandlePool(files, nhandles);
    }

    thread_t *threads = new thread_t[writers + readers];

    struct ops_args oa{hp, (float)time, useSnapHandlePool};

    int threadid = 0;
    // Spawn writer thread(s)
    for (int i = 0; i < writers; ++i) {
        thread_create(&threads[threadid++], invoke_writer_ops, &oa);
    }

    // Spawn reader thread(s)
    for (int i = 0; i < readers; ++i) {
        thread_create(&threads[threadid++], invoke_reader_ops, &oa);
    }

    assert(threadid == readers + writers);

    // Wait for child threads
    for (int j = 0; j < (readers + writers); ++j) {
        int r = thread_join(threads[j], nullptr);
        assert(r == 0);
    }
    delete[] threads;

    std::string test_title(std::to_string(nhandles) + "H, " +
                           std::to_string(nfiles) + "F, " +
                           std::to_string(writers) + "RW, " +
                           std::to_string(readers) + "RO - ");
    test_title += useSnapHandlePool ? "Seperate Pool test" : "Shared Pool test";

    /* Print Collected Stats */
    hp->displayCollection(test_title.c_str());

#ifdef __DEBUG_USECASE
    hp->printHandleStats();
#endif

    /* cleanup */
    delete hp;

    /* shutdown */
    fdb_shutdown();

#ifndef __DEBUG_USECASE
    r = system(SHELL_DEL" usecase_test* > errorlog.txt");
    (void)r;
#endif

    memleak_end();
    TEST_RESULT(test_title.c_str());
}